

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void do_rename(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *ch_00;
  FILE *pFVar5;
  CHAR_DATA *pCVar6;
  char *pcVar7;
  char new_name [4608];
  char old_name [4608];
  char strsave [4608];
  char local_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4608];
  
  pcVar4 = one_argument(argument,local_2428);
  one_argument(pcVar4,local_3628);
  if (local_2428[0] == '\0') {
    pcVar4 = "Rename who?\n\r";
  }
  else if (local_3628[0] == '\0') {
    pcVar4 = "Rename to what new name?\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_2428);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar4 = "There is no such a person online.\n\r";
    }
    else {
      bVar1 = is_npc(ch_00);
      if (bVar1) {
        pcVar4 = "Use string.\n\r";
      }
      else {
        if (ch_00 != ch) {
          iVar2 = get_trust(ch_00);
          iVar3 = get_trust(ch);
          if (iVar3 <= iVar2) {
            pcVar4 = "You failed.\n\r";
            goto LAB_00280451;
          }
        }
        if ((ch_00->desc == (DESCRIPTOR_DATA *)0x0) || (ch_00->desc->connected != 0)) {
          pcVar4 = "They are link-dead.\n\r";
        }
        else {
          bVar1 = check_parse_name(local_3628);
          if (bVar1) {
            bVar1 = is_affected(ch_00,(int)gsn_cloak_form);
            if ((bVar1) || (bVar1 = is_shifted(ch_00), bVar1)) {
              pcVar4 = "They must be in normal form.\n\r";
            }
            else {
              pcVar4 = capitalize(local_3628);
              sprintf(local_1228,"%s/%s.plr","../player",pcVar4);
              pFVar5 = fopen(local_1228,"r");
              if (pFVar5 == (FILE *)0x0) {
                pCVar6 = get_char_world(ch,local_3628);
                if (pCVar6 == (CHAR_DATA *)0x0) {
                  pcVar4 = capitalize(local_3628);
                  CSQLInterface::Update
                            (&RS.SQL,"players SET name = \'%s\' WHERE name = \'%s\' LIMIT 1",pcVar4,
                             ch_00->true_name);
                  pcVar4 = palloc_string(ch_00->true_name);
                  free_pstring(ch_00->name);
                  free_pstring(ch_00->true_name);
                  free_pstring(ch_00->backup_true_name);
                  pcVar7 = capitalize(local_3628);
                  pcVar7 = palloc_string(pcVar7);
                  ch_00->name = pcVar7;
                  pcVar7 = capitalize(local_3628);
                  pcVar7 = palloc_string(pcVar7);
                  ch_00->true_name = pcVar7;
                  pcVar7 = capitalize(local_3628);
                  pcVar7 = palloc_string(pcVar7);
                  ch_00->backup_true_name = pcVar7;
                  save_char_obj(ch_00);
                  delete_char(pcVar4,false);
                  send_to_char("Character renamed.\n\r",ch);
                  act_new("$n has renamed you to $N!",ch,(void *)0x0,ch_00,2,5);
                  return;
                }
                pcVar4 = "A player with the name you specified already exists.\n\r";
              }
              else {
                pcVar4 = "A player with that name already exists.\n\r";
              }
            }
          }
          else {
            pcVar4 = "That new name is illegal.\n\r";
          }
        }
      }
    }
  }
LAB_00280451:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_rename(CHAR_DATA *ch, char *argument)
{
	char old_name[MAX_INPUT_LENGTH], new_name[MAX_INPUT_LENGTH], strsave[MAX_INPUT_LENGTH], pbuf[MSL], *cname;
	CHAR_DATA *victim;
	int cres = 0;

	argument = one_argument(argument, old_name);
	one_argument(argument, new_name);

	if (old_name[0] == '\0')
	{
		send_to_char("Rename who?\n\r", ch);
		return;
	}

	if (new_name[0] == '\0')
	{
		send_to_char("Rename to what new name?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, old_name);

	if (!victim)
	{
		send_to_char("There is no such a person online.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Use string.\n\r", ch);
		return;
	}

	if ((victim != ch) && (get_trust(victim) >= get_trust(ch)))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (!victim->desc || (victim->desc->connected != CON_PLAYING))
	{
		send_to_char("They are link-dead.\n\r", ch);
		return;
	}

	if (!check_parse_name(new_name))
	{
		send_to_char("That new name is illegal.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_cloak_form) || is_shifted(victim))
	{
		send_to_char("They must be in normal form.\n\r", ch);
		return;
	}

	sprintf(strsave, "%s/%s.plr", RIFT_PLAYER_DIR, capitalize(new_name));

	if (fopen(strsave, "r") != nullptr)
	{
		send_to_char("A player with that name already exists.\n\r", ch);
		return;
	}

	if (get_char_world(ch, new_name))
	{
		send_to_char("A player with the name you specified already exists.\n\r", ch);
		return;
	}

	cres = RS.SQL.Update("players SET name = '%s' WHERE name = '%s' LIMIT 1", capitalize(new_name), victim->true_name);
	cname = palloc_string(victim->true_name);

	free_pstring(victim->name);
	free_pstring(victim->true_name);
	free_pstring(victim->backup_true_name);
	victim->name = palloc_string(capitalize(new_name));
	victim->true_name = palloc_string(capitalize(new_name));
	victim->backup_true_name = palloc_string(capitalize(new_name));

	save_char_obj(victim);

	delete_char(cname, false);

	//	unlink(strsave);

	send_to_char("Character renamed.\n\r", ch);
	act("$n has renamed you to $N!", ch, nullptr, victim, TO_VICT);
}